

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          ArrayGet *curr)

{
  uint uVar1;
  Literal *pLVar2;
  long lVar3;
  shared_ptr<wasm::GCData> sVar4;
  undefined1 local_130 [8];
  Flow ref;
  Flow index;
  undefined1 auStack_88 [8];
  Field field;
  Literal local_70;
  Literal local_58;
  undefined1 local_40 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_130,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&ref.breakTo.super_IString.str._M_str,this,curr->index);
    if (index.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)local_130);
      sVar4 = Literal::getGCData((Literal *)local_40);
      if (local_40 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"null ref",
                   sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
      }
      pLVar2 = Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
      uVar1 = Literal::geti32(pLVar2);
      lVar3 = (long)(((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar3 / 0x18 +
          (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed <=
          (ulong)uVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar3 % 0x18);
      }
      wasm::Type::getHeapType(&curr->ref->type);
      HeapType::getArray((HeapType *)&index.breakTo.super_IString.str._M_str);
      auStack_88 = (undefined1  [8])index.breakTo.super_IString.str._M_str;
      pLVar2 = (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start + ((ulong)uVar1 - 1);
      if (uVar1 == 0) {
        pLVar2 = (((Literals *)((long)local_40 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                 _M_elems;
      }
      Literal::Literal(&local_58,pLVar2);
      extendForPacking(&local_70,this,&local_58,(Field *)auStack_88,curr->signed_);
      Flow::Flow(__return_storage_ptr__,&local_70);
      Literal::~Literal(&local_70);
      Literal::~Literal(&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_130);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayGet(ArrayGet* curr) {
    NOTE_ENTER("ArrayGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    return extendForPacking(data->values[i], field, curr->signed_);
  }